

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void * google::protobuf::DynamicMessage::NewImpl(void *prototype,void *mem,Arena *arena)

{
  TypeInfo *type_info;
  
  type_info = *(TypeInfo **)((long)prototype + 0x10);
  memset(mem,0,(ulong)(type_info->class_data).super_ClassData.message_creator.allocation_size_);
  DynamicMessage((DynamicMessage *)mem,type_info,arena);
  return mem;
}

Assistant:

void* DynamicMessage::NewImpl(const void* prototype, void* mem, Arena* arena) {
  const auto* type_info =
      static_cast<const DynamicMessage*>(prototype)->type_info_;
  memset(mem, 0, type_info->class_data.allocation_size());
  return new (mem) DynamicMessage(type_info, arena);
}